

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

void __thiscall
ON_SubDVertexIterator::Internal_Init
          (ON_SubDVertexIterator *this,ON_SubDRef *subd_ref,uint vertex_count,ON_SubDVertex *first,
          ON_SubDVertex *last,ON_SubDComponentPtr component_ptr)

{
  Type TVar1;
  ON_SubDComponentPtr *local_48;
  ON_SubDVertex *last_local;
  ON_SubDVertex *first_local;
  uint vertex_count_local;
  ON_SubDRef *subd_ref_local;
  ON_SubDVertexIterator *this_local;
  ON_SubDComponentPtr component_ptr_local;
  
  this_local = (ON_SubDVertexIterator *)component_ptr.m_ptr;
  ON_SubDRef::operator=(&this->m_subd_ref,subd_ref);
  if (((first != (ON_SubDVertex *)0x0) && (last != (ON_SubDVertex *)0x0)) && (vertex_count != 0)) {
    this->m_v_first = first;
    this->m_v_last = last;
    this->m_v_current = this->m_v_first;
    this->m_vertex_count = vertex_count;
    TVar1 = ON_SubDComponentPtr::ComponentType((ON_SubDComponentPtr *)&this_local);
    if (TVar1 == Unset) {
      local_48 = &ON_SubDComponentPtr::Null;
    }
    else {
      local_48 = (ON_SubDComponentPtr *)&this_local;
    }
    (this->m_component_ptr).m_ptr = (ON__UINT_PTR)local_48->m_ptr;
  }
  return;
}

Assistant:

void ON_SubDVertexIterator::Internal_Init(
  const ON_SubDRef& subd_ref,
  unsigned int vertex_count,
  const ON_SubDVertex* first,
  const ON_SubDVertex* last,
  ON_SubDComponentPtr component_ptr
)
{
  m_subd_ref = subd_ref;
  if (nullptr != first && nullptr != last && vertex_count > 0)
  {
    m_v_first = first;
    m_v_last = last;
    m_v_current = m_v_first;
    m_vertex_count = vertex_count;
    m_component_ptr
      = (ON_SubDComponentPtr::Type::Unset == component_ptr.ComponentType())
      ? ON_SubDComponentPtr::Null
      : component_ptr;
  }
}